

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdiriterator.cpp
# Opt level: O1

void __thiscall QDirIteratorPrivate::advance(QDirIteratorPrivate *this)

{
  QFileInfo *fileinfo;
  totally_ordered_wrapper<QFileInfoPrivate_*> tVar1;
  DirEntry DVar2;
  long in_FS_OFFSET;
  QSharedDataPointer<QFileInfoPrivate> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->it).dirEntry.dirListPtr == (QDirListingPrivate *)0x0) {
    QFileInfo::QFileInfo((QFileInfo *)&local_28);
    tVar1.ptr = (this->currentFileInfo).d_ptr.d.ptr;
    (this->currentFileInfo).d_ptr.d.ptr = (QFileInfoPrivate *)local_28.d.ptr;
    local_28.d.ptr =
         (totally_ordered_wrapper<QFileInfoPrivate_*>)
         (totally_ordered_wrapper<QFileInfoPrivate_*>)tVar1.ptr;
  }
  else {
    fileinfo = &this->nextFileInfo;
    QFileInfo::operator=(&this->currentFileInfo,fileinfo);
    DVar2 = QDirListing::next((this->it).dirEntry.dirListPtr);
    (this->it).dirEntry.dirListPtr = DVar2.dirListPtr;
    if (DVar2.dirListPtr == (QDirListingPrivate *)0x0) goto LAB_00234f19;
    QDirListing::DirEntry::fileInfo((DirEntry *)&local_28);
    tVar1.ptr = (fileinfo->d_ptr).d.ptr;
    (fileinfo->d_ptr).d.ptr = (QFileInfoPrivate *)local_28.d.ptr;
    local_28.d.ptr =
         (totally_ordered_wrapper<QFileInfoPrivate_*>)
         (totally_ordered_wrapper<QFileInfoPrivate_*>)tVar1.ptr;
  }
  QFileInfo::~QFileInfo((QFileInfo *)&local_28);
LAB_00234f19:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void advance()
    {
        // Match the behavior of advance() from before porting to QDirListing,
        // that is, even if hasNext() returns false, calling next() returns an
        // empty string without crashing. QTBUG-130142
        if (it == lister.end()) {
            currentFileInfo = {};
            return;
        }
        currentFileInfo = nextFileInfo;
        if (++it != lister.end()) {
            nextFileInfo = it->fileInfo();
        }
    }